

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

int dePop32(deUint32 a)

{
  uint uVar1;
  deUint32 t;
  deUint32 mask4;
  deUint32 mask3;
  deUint32 mask2;
  deUint32 mask1;
  deUint32 mask0;
  deUint32 a_local;
  
  uVar1 = (a & 0x55555555) + (a >> 1 & 0x55555555);
  uVar1 = (uVar1 & 0x33333333) + (uVar1 >> 2 & 0x33333333);
  uVar1 = (uVar1 & 0xf0f0f0f) + (uVar1 >> 4 & 0xf0f0f0f);
  uVar1 = (uVar1 & 0xff00ff) + (uVar1 >> 8 & 0xff00ff);
  return (uVar1 & 0xffff) + (uVar1 >> 0x10);
}

Assistant:

DE_INLINE int dePop32 (deUint32 a)
{
	deUint32 mask0 = 0x55555555; /* 1-bit values. */
	deUint32 mask1 = 0x33333333; /* 2-bit values. */
	deUint32 mask2 = 0x0f0f0f0f; /* 4-bit values. */
	deUint32 mask3 = 0x00ff00ff; /* 8-bit values. */
	deUint32 mask4 = 0x0000ffff; /* 16-bit values. */
	deUint32 t = (deUint32)a;
	t = (t & mask0) + ((t>>1) & mask0);
	t = (t & mask1) + ((t>>2) & mask1);
	t = (t & mask2) + ((t>>4) & mask2);
	t = (t & mask3) + ((t>>8) & mask3);
	t = (t & mask4) + (t>>16);
	return (int)t;
}